

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O1

void __thiscall ncnn::ConvolutionDepthWise_x86::destroy_pipeline(ConvolutionDepthWise_x86 *this)

{
  Option *in_RSI;
  
  destroy_pipeline((ConvolutionDepthWise_x86 *)
                   ((long)&this->_vptr_ConvolutionDepthWise_x86 +
                   (long)this->_vptr_ConvolutionDepthWise_x86[-7]),in_RSI);
  return;
}

Assistant:

int ConvolutionDepthWise_x86::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (activation)
    {
        activation->destroy_pipeline(opt_cpu);
        delete activation;
        activation = 0;
    }

    for (int i=0; i<(int)group_ops.size(); i++)
    {
        group_ops[i]->destroy_pipeline(opt_cpu);
        delete group_ops[i];
    }
    group_ops.clear();

    return 0;
}